

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_matrix.cpp
# Opt level: O0

uint __thiscall
ON_SubDSectorType::GetSubdivisionMatrix(ON_SubDSectorType *this,double *S,size_t S_capacity)

{
  uint uVar1;
  ulong uVar2;
  double **S_00;
  uint local_3c;
  uint rc;
  uint i;
  double **Srows;
  uint R;
  size_t S_capacity_local;
  double *S_local;
  ON_SubDSectorType *this_local;
  
  if ((S_capacity < 9) || (S == (double *)0x0)) {
    ON_SubDIncrementErrorCount();
    this_local._4_4_ = 0;
  }
  else {
    uVar1 = PointRingCount(this);
    if (uVar1 < 3) {
      ON_SubDIncrementErrorCount();
      this_local._4_4_ = 0;
    }
    else if (S_capacity < uVar1 * uVar1) {
      ON_SubDIncrementErrorCount();
      this_local._4_4_ = 0;
    }
    else {
      uVar2 = SUB168(ZEXT416(uVar1) * ZEXT816(8),0);
      if (SUB168(ZEXT416(uVar1) * ZEXT816(8),8) != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      S_00 = (double **)operator_new__(uVar2,(nothrow_t *)&std::nothrow);
      if (S_00 == (double **)0x0) {
        ON_SubDIncrementErrorCount();
        this_local._4_4_ = 0;
      }
      else {
        *S_00 = S;
        for (local_3c = 1; local_3c < uVar1; local_3c = local_3c + 1) {
          S_00[local_3c] = S_00[local_3c - 1] + uVar1;
        }
        this_local._4_4_ = GetSubdivisionMatrix(this,S_00,(ulong)uVar1);
        if (S_00 != (double **)0x0) {
          operator_delete__(S_00);
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

unsigned int ON_SubDSectorType::GetSubdivisionMatrix(
  double* S,
  size_t S_capacity
  ) const
{
  if ( S_capacity < 9 || nullptr == S )
    return ON_SUBD_RETURN_ERROR(0);

  const unsigned int R = PointRingCount();
  if (R < 3)
    return ON_SUBD_RETURN_ERROR(0);

  if ( S_capacity < R*R )
    return ON_SUBD_RETURN_ERROR(0);

  double** Srows = new(std::nothrow) double* [R];
  if ( nullptr == Srows)
    return ON_SUBD_RETURN_ERROR(0);
  Srows[0] = S;
  for (unsigned int i = 1; i < R; i++)
  {
    Srows[i] = Srows[i-1] + R;
  }

  const unsigned int rc = GetSubdivisionMatrix(Srows, R);
  
  delete[] Srows;

  return rc;
}